

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O0

detail * __thiscall prometheus::detail::base64_encode(detail *this,string *input)

{
  ulong uVar1;
  byte *pbVar2;
  ulong uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ulong local_40;
  size_t i;
  const_iterator it;
  uint32_t temp;
  string *input_local;
  string *encoded;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)this);
  it._M_current._0_4_ = 0;
  i = ::std::__cxx11::string::begin();
  for (local_40 = 0; uVar3 = local_40, uVar1 = ::std::__cxx11::string::size(), uVar3 < uVar1 / 3;
      local_40 = local_40 + 1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_48);
    it._M_current._0_4_ = (uint)*pbVar2 << 0x10;
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
    it._M_current._0_4_ = (int)it._M_current + (uint)*pbVar2 * 0x100;
    local_58 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_58);
    it._M_current._0_4_ = (int)it._M_current + (uint)*pbVar2;
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
  }
  uVar3 = ::std::__cxx11::string::size();
  if (uVar3 % 3 == 1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_60);
    it._M_current._0_4_ = (uint)*pbVar2 << 0x10;
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x02');
  }
  else if (uVar3 % 3 == 2) {
    local_68 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
    it._M_current._0_4_ = (uint)*pbVar2 << 0x10;
    local_70 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&i,0);
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_70);
    it._M_current._0_4_ = (int)it._M_current + (uint)*pbVar2 * 0x100;
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
    ::std::__cxx11::string::append((ulong)this,'\x01');
  }
  return this;
}

Assistant:

inline std::string base64_encode(const std::string& input) {
  std::string encoded;
  encoded.reserve(((input.size() / 3) + (input.size() % 3 > 0)) * 4);

  std::uint32_t temp{};
  auto it = input.begin();

  for (std::size_t i = 0; i < input.size() / 3; ++i) {
    temp = static_cast<std::uint8_t>(*it++) << 16;
    temp += static_cast<std::uint8_t>(*it++) << 8;
    temp += static_cast<std::uint8_t>(*it++);
    encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
    encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
    encoded.append(1, kEncodeLookup[(temp & 0x00000FC0) >> 6]);
    encoded.append(1, kEncodeLookup[(temp & 0x0000003F)]);
  }

  switch (input.size() % 3) {
    case 1:
      temp = static_cast<std::uint8_t>(*it++) << 16;
      encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
      encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
      encoded.append(2, kPadCharacter);
      break;
    case 2:
      temp = static_cast<std::uint8_t>(*it++) << 16;
      temp += static_cast<std::uint8_t>(*it++) << 8;
      encoded.append(1, kEncodeLookup[(temp & 0x00FC0000) >> 18]);
      encoded.append(1, kEncodeLookup[(temp & 0x0003F000) >> 12]);
      encoded.append(1, kEncodeLookup[(temp & 0x00000FC0) >> 6]);
      encoded.append(1, kPadCharacter);
      break;
  }

  return encoded;
}